

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int pagerOpenWalIfPresent(Pager *pPager)

{
  _func_int_sqlite3_vfs_ptr_char_ptr_int *p_Var1;
  int iVar2;
  long in_FS_OFFSET;
  Pgno nPage;
  int isWal;
  Pgno local_18;
  int local_14;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = 0;
  if (pPager->tempFile == '\0') {
    local_14 = -0x55555556;
    iVar2 = (*pPager->pVfs->xAccess)(pPager->pVfs,pPager->zWal,0,&local_14);
    if (iVar2 == 0) {
      if (local_14 == 0) {
        if (pPager->journalMode == '\x05') {
          pPager->journalMode = '\0';
        }
      }
      else {
        local_18 = 0xaaaaaaaa;
        iVar2 = pagerPagecount(pPager,&local_18);
        if (iVar2 == 0) {
          if (local_18 == 0) {
            p_Var1 = pPager->pVfs->xDelete;
            if (p_Var1 == (_func_int_sqlite3_vfs_ptr_char_ptr_int *)0x0) {
              iVar2 = 0;
            }
            else {
              iVar2 = (*p_Var1)(pPager->pVfs,pPager->zWal,0);
            }
          }
          else {
            iVar2 = sqlite3PagerOpenWal(pPager,(int *)0x0);
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

static int pagerOpenWalIfPresent(Pager *pPager){
  int rc = SQLITE_OK;
  assert( pPager->eState==PAGER_OPEN );
  assert( pPager->eLock>=SHARED_LOCK );

  if( !pPager->tempFile ){
    int isWal;                    /* True if WAL file exists */
    rc = sqlite3OsAccess(
        pPager->pVfs, pPager->zWal, SQLITE_ACCESS_EXISTS, &isWal
    );
    if( rc==SQLITE_OK ){
      if( isWal ){
        Pgno nPage;                   /* Size of the database file */

        rc = pagerPagecount(pPager, &nPage);
        if( rc ) return rc;
        if( nPage==0 ){
          rc = sqlite3OsDelete(pPager->pVfs, pPager->zWal, 0);
        }else{
          testcase( sqlite3PcachePagecount(pPager->pPCache)==0 );
          rc = sqlite3PagerOpenWal(pPager, 0);
        }
      }else if( pPager->journalMode==PAGER_JOURNALMODE_WAL ){
        pPager->journalMode = PAGER_JOURNALMODE_DELETE;
      }
    }
  }
  return rc;
}